

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v8::basic_memory_buffer<int,_500UL,_std::allocator<int>_>::grow
          (basic_memory_buffer<int,_500UL,_std::allocator<int>_> *this,size_t size)

{
  size_t __t;
  int *piVar1;
  pointer p;
  size_t sVar2;
  int *__result;
  int *local_50;
  int *new_data;
  int *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  size_t size_local;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> *this_local;
  
  local_50 = (int *)std::allocator_traits<std::allocator<int>_>::max_size
                              ((allocator_type *)&this->field_0x7f0);
  __t = detail::buffer<int>::capacity(&this->super_buffer<int>);
  piVar1 = (int *)(__t + (__t >> 1));
  old_data = (int *)size;
  if ((size <= piVar1) && (old_data = piVar1, local_50 < piVar1)) {
    if (local_50 < size) {
      local_50 = (int *)size;
    }
    old_data = local_50;
  }
  piVar1 = detail::buffer<int>::data(&this->super_buffer<int>);
  p = std::allocator_traits<std::allocator<int>_>::allocate
                ((allocator_type *)&this->field_0x7f0,(size_type)old_data);
  sVar2 = detail::buffer<int>::size(&this->super_buffer<int>);
  __result = detail::make_checked<int>(p,(size_t)old_data);
  std::uninitialized_copy<int*,int*>(piVar1,piVar1 + sVar2,__result);
  detail::buffer<int>::set(&this->super_buffer<int>,p,(size_t)old_data);
  if (piVar1 != this->store_) {
    __gnu_cxx::new_allocator<int>::deallocate((new_allocator<int> *)&this->field_0x7f0,piVar1,__t);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void basic_memory_buffer<T, SIZE, Allocator>::grow(
    size_t size) {
#ifdef FMT_FUZZ
  if (size > 5000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity)
    new_capacity = size;
  else if (new_capacity > max_size)
    new_capacity = size > max_size ? size : max_size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}